

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O2

CURLcode Curl_auth_decode_ntlm_type2_message(Curl_easy *data,char *type2msg,ntlmdata *ntlm)

{
  uchar *puVar1;
  size_t sVar2;
  unsigned_short uVar3;
  CURLcode CVar4;
  uint uVar5;
  uint uVar6;
  void *__dest;
  char *fmt;
  uchar *type2;
  size_t type2_len;
  
  type2 = (uchar *)0x0;
  type2_len = 0;
  if ((*type2msg != '\0') && (*type2msg != '=')) {
    CVar4 = Curl_base64_decode(type2msg,&type2,&type2_len);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    if (type2 != (uchar *)0x0) {
      ntlm->flags = 0;
      if (((0x1f < type2_len) && (*(long *)type2 == 0x5053534d4c544e)) && (*(int *)(type2 + 8) == 2)
         ) {
        uVar5 = Curl_read32_le(type2 + 0x14);
        sVar2 = type2_len;
        puVar1 = type2;
        ntlm->flags = uVar5;
        *(undefined8 *)ntlm->nonce = *(undefined8 *)(type2 + 0x18);
        if ((uVar5 >> 0x17 & 1) != 0) {
          uVar5 = 0;
          if (0x2f < type2_len) {
            uVar3 = Curl_read16_le(type2 + 0x28);
            uVar6 = Curl_read32_le(puVar1 + 0x2c);
            uVar5 = 0;
            if (uVar3 != 0) {
              if ((sVar2 <= uVar6) || (uVar5 = (uint)uVar3, uVar6 < 0x30 || sVar2 < uVar6 + uVar5))
              {
                Curl_infof(data,
                           "NTLM handshake failure (bad type-2 message). Target Info Offset Len is set incorrect by the peer\n"
                          );
                CVar4 = CURLE_BAD_CONTENT_ENCODING;
LAB_00143504:
                (*Curl_cfree)(type2);
                Curl_infof(data,"NTLM handshake failure (bad type-2 message)\n");
                return CVar4;
              }
              __dest = (*Curl_cmalloc)((ulong)uVar5);
              ntlm->target_info = __dest;
              if (__dest == (void *)0x0) {
                CVar4 = CURLE_OUT_OF_MEMORY;
                goto LAB_00143504;
              }
              memcpy(__dest,puVar1 + uVar6,(ulong)uVar5);
            }
          }
          ntlm->target_info_len = uVar5;
        }
        (*Curl_cfree)(type2);
        return CURLE_OK;
      }
      (*Curl_cfree)(type2);
      fmt = "NTLM handshake failure (bad type-2 message)\n";
      goto LAB_00143403;
    }
  }
  fmt = "NTLM handshake failure (empty type-2 message)\n";
LAB_00143403:
  Curl_infof(data,fmt);
  return CURLE_BAD_CONTENT_ENCODING;
}

Assistant:

CURLcode Curl_auth_decode_ntlm_type2_message(struct Curl_easy *data,
                                             const char *type2msg,
                                             struct ntlmdata *ntlm)
{
  static const char type2_marker[] = { 0x02, 0x00, 0x00, 0x00 };

  /* NTLM type-2 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x02000000)
           12    Target Name            security buffer
           20    Flags                  long
           24    Challenge              8 bytes
          (32)   Context                8 bytes (two consecutive longs) (*)
          (40)   Target Information     security buffer (*)
          (48)   OS Version Structure   8 bytes (*)
  32 (48) (56)   Start of data block    (*)
                                        (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  unsigned char *type2 = NULL;
  size_t type2_len = 0;

#if defined(NTLM_NEEDS_NSS_INIT)
  /* Make sure the crypto backend is initialized */
  result = Curl_nss_force_init(data);
  if(result)
    return result;
#elif defined(CURL_DISABLE_VERBOSE_STRINGS)
  (void)data;
#endif

  /* Decode the base-64 encoded type-2 message */
  if(strlen(type2msg) && *type2msg != '=') {
    result = Curl_base64_decode(type2msg, &type2, &type2_len);
    if(result)
      return result;
  }

  /* Ensure we have a valid type-2 message */
  if(!type2) {
    infof(data, "NTLM handshake failure (empty type-2 message)\n");
    return CURLE_BAD_CONTENT_ENCODING;
  }

  ntlm->flags = 0;

  if((type2_len < 32) ||
     (memcmp(type2, NTLMSSP_SIGNATURE, 8) != 0) ||
     (memcmp(type2 + 8, type2_marker, sizeof(type2_marker)) != 0)) {
    /* This was not a good enough type-2 message */
    free(type2);
    infof(data, "NTLM handshake failure (bad type-2 message)\n");
    return CURLE_BAD_CONTENT_ENCODING;
  }

  ntlm->flags = Curl_read32_le(&type2[20]);
  memcpy(ntlm->nonce, &type2[24], 8);

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_TARGET_INFO) {
    result = ntlm_decode_type2_target(data, type2, type2_len, ntlm);
    if(result) {
      free(type2);
      infof(data, "NTLM handshake failure (bad type-2 message)\n");
      return result;
    }
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE2 header flags=0x%08.8lx ", ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n                  nonce=");
    ntlm_print_hex(stderr, (char *)ntlm->nonce, 8);
    fprintf(stderr, "\n****\n");
    fprintf(stderr, "**** Header %s\n ", header);
  });

  free(type2);

  return result;
}